

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor.c
# Opt level: O3

int coda_cursor_set_product(coda_cursor_conflict *cursor,coda_product *product)

{
  int iVar1;
  undefined8 uVar2;
  char *message;
  
  if (cursor == (coda_cursor_conflict *)0x0) {
    message = "cursor argument is NULL (%s:%u)";
    uVar2 = 0x140;
  }
  else {
    if (product != (coda_product *)0x0) {
      switch(product->format) {
      case coda_format_ascii:
      case coda_format_binary:
        iVar1 = coda_ascbin_cursor_set_product(cursor,product);
        return iVar1;
      case coda_format_xml:
        iVar1 = coda_xml_cursor_set_product(cursor,product);
        return iVar1;
      case coda_format_hdf4:
        iVar1 = -0xb;
        break;
      case coda_format_hdf5:
        iVar1 = -0xd;
        break;
      case coda_format_cdf:
        iVar1 = coda_cdf_cursor_set_product(cursor,product);
        return iVar1;
      case coda_format_netcdf:
        iVar1 = coda_netcdf_cursor_set_product(cursor,product);
        return iVar1;
      case coda_format_grib:
        iVar1 = coda_grib_cursor_set_product(cursor,product);
        return iVar1;
      case coda_format_rinex:
        iVar1 = coda_rinex_cursor_set_product(cursor,product);
        return iVar1;
      case coda_format_sp3:
        iVar1 = coda_sp3_cursor_set_product(cursor,product);
        return iVar1;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor.c"
                      ,0x16b,"int coda_cursor_set_product(coda_cursor *, coda_product *)");
      }
      coda_set_error(iVar1,(char *)0x0);
      return -1;
    }
    message = "product file argument is NULL (%s:%u)";
    uVar2 = 0x146;
  }
  coda_set_error(-100,message,
                 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor.c"
                 ,uVar2);
  return -1;
}

Assistant:

LIBCODA_API int coda_cursor_set_product(coda_cursor *cursor, coda_product *product)
{
    if (cursor == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "cursor argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    if (product == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "product file argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    switch (product->format)
    {
        case coda_format_ascii:
        case coda_format_binary:
            return coda_ascbin_cursor_set_product(cursor, product);
        case coda_format_xml:
            return coda_xml_cursor_set_product(cursor, product);
        case coda_format_cdf:
            return coda_cdf_cursor_set_product(cursor, product);
        case coda_format_netcdf:
            return coda_netcdf_cursor_set_product(cursor, product);
        case coda_format_grib:
            return coda_grib_cursor_set_product(cursor, product);
        case coda_format_hdf4:
#ifdef HAVE_HDF4
            return coda_hdf4_cursor_set_product(cursor, product);
#else
            coda_set_error(CODA_ERROR_NO_HDF4_SUPPORT, NULL);
            return -1;
#endif
        case coda_format_hdf5:
#ifdef HAVE_HDF5
            return coda_hdf5_cursor_set_product(cursor, product);
#else
            coda_set_error(CODA_ERROR_NO_HDF5_SUPPORT, NULL);
            return -1;
#endif
        case coda_format_rinex:
            return coda_rinex_cursor_set_product(cursor, product);
        case coda_format_sp3:
            return coda_sp3_cursor_set_product(cursor, product);
    }

    assert(0);
    exit(1);
}